

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
::reserve(vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
          *this,size_t n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  memory_resource *pmVar4;
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar5;
  undefined8 uVar6;
  int iVar7;
  undefined4 extraout_var;
  size_t sVar9;
  long lVar10;
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar8;
  
  if (n <= this->nAlloc) {
    return;
  }
  if (n * 0x18 == 0) {
    poVar8 = (optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *)0x0;
  }
  else {
    pmVar4 = (this->alloc).memoryResource;
    iVar7 = (*pmVar4->_vptr_memory_resource[2])(pmVar4,n * 0x18,8);
    poVar8 = (optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *)CONCAT44(extraout_var,iVar7);
  }
  poVar5 = this->ptr;
  sVar9 = this->nStored;
  if (sVar9 == 0) {
    if (poVar5 == (optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *)0x0) goto LAB_0036c809;
  }
  else {
    lVar10 = 0;
    do {
      bVar3 = (&poVar5->set)[lVar10];
      (&poVar8->set)[lVar10] = bVar3;
      if (bVar3 == true) {
        *(undefined8 *)((long)&poVar8->optionalValue + lVar10) = 0;
        puVar1 = (undefined8 *)((long)&poVar5->optionalValue + lVar10);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&poVar8->optionalValue + lVar10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
LAB_0036c7da:
        (&poVar5->set)[lVar10] = false;
      }
      else if (bVar3 != false) goto LAB_0036c7da;
      lVar10 = lVar10 + 0x18;
      sVar9 = sVar9 - 1;
    } while (sVar9 != 0);
  }
  pmVar4 = (this->alloc).memoryResource;
  (*pmVar4->_vptr_memory_resource[3])(pmVar4,poVar5,this->nAlloc * 0x18,8);
LAB_0036c809:
  this->nAlloc = n;
  this->ptr = poVar8;
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }